

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tester.h
# Opt level: O0

void __thiscall
density_tests::
QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
::ThreadData::start(ThreadData *this,size_t i_thread_index,size_t i_target_put_count,
                   size_t i_target_consume_count,uint64_t i_affinity_mask)

{
  ostream *poVar1;
  char *pcVar2;
  string local_200 [48];
  ostringstream local_1d0 [8];
  ostringstream thread_name;
  type local_58;
  thread local_38;
  uint64_t local_30;
  uint64_t i_affinity_mask_local;
  size_t i_target_consume_count_local;
  size_t i_target_put_count_local;
  size_t i_thread_index_local;
  ThreadData *this_local;
  
  local_58.this = (ThreadData *)this;
  local_58.i_target_put_count = i_target_put_count;
  local_58.i_target_consume_count = i_target_consume_count;
  local_58.i_affinity_mask = i_affinity_mask;
  local_30 = i_affinity_mask;
  i_affinity_mask_local = i_target_consume_count;
  i_target_consume_count_local = i_target_put_count;
  i_target_put_count_local = i_thread_index;
  i_thread_index_local = (size_t)this;
  std::thread::
  thread<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)1>>::ThreadData::start(unsigned_long,unsigned_long,unsigned_long,unsigned_long)::_lambda()_1_,,void>
            (&local_38,&local_58);
  std::thread::operator=((thread *)(this + 0x18),&local_38);
  std::thread::~thread(&local_38);
  std::__cxx11::ostringstream::ostringstream(local_1d0);
  poVar1 = (ostream *)std::ostream::operator<<(local_1d0,i_target_put_count_local);
  std::operator<<(poVar1,"_");
  if (i_target_consume_count_local == 0) {
    std::operator<<((ostream *)local_1d0,"consumer");
  }
  else if (i_affinity_mask_local == 0) {
    std::operator<<((ostream *)local_1d0,"producer");
  }
  else {
    std::operator<<((ostream *)local_1d0,"producer_consumer");
  }
  std::__cxx11::ostringstream::str();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  set_thread_name((thread *)(this + 0x18),pcVar2);
  std::__cxx11::string::~string(local_200);
  std::__cxx11::ostringstream::~ostringstream(local_1d0);
  return;
}

Assistant:

void start(
              size_t   i_thread_index,
              size_t   i_target_put_count,
              size_t   i_target_consume_count,
              uint64_t i_affinity_mask)
            {
                m_thread = std::thread([=] {
                    thread_procedure(i_target_put_count, i_target_consume_count, i_affinity_mask);
                });

                // give a name to the thread
                std::ostringstream thread_name;
                thread_name << i_thread_index << "_";
                if (i_target_put_count == 0)
                    thread_name << "consumer";
                else if (i_target_consume_count == 0)
                    thread_name << "producer";
                else
                    thread_name << "producer_consumer";
                set_thread_name(m_thread, thread_name.str().c_str());
            }